

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module.cpp
# Opt level: O3

void __thiscall sc_core::sc_module::elaboration_done(sc_module *this,bool *error_)

{
  char *__s;
  size_t sVar1;
  stringstream msg;
  char *local_1c8;
  char local_1b8 [16];
  stringstream local_1a8 [16];
  long local_198 [47];
  
  if (this->m_end_module_called == false) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"module \'",8);
    __s = (this->super_sc_object).m_name._M_dataplus._M_p;
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
    }
    else {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\'",1);
    std::__cxx11::stringbuf::str();
    sc_report_handler::report
              (SC_WARNING,
               "module construction not properly completed: did you forget to add a sc_module_name parameter to your module constructor?"
               ,local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_module.cpp"
               ,0x199);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    if (*error_ == true) {
      sc_report_handler::report
                (SC_WARNING,"hierarchical name as shown may be incorrect due to previous errors",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_module.cpp"
                 ,0x19b);
    }
    *error_ = true;
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  sc_simcontext::hierarchy_push((this->super_sc_object).m_simc,this);
  (*(this->super_sc_object)._vptr_sc_object[0x10])(this);
  sc_simcontext::hierarchy_pop((this->super_sc_object).m_simc);
  return;
}

Assistant:

void
sc_module::elaboration_done( bool& error_ )
{
    if( ! m_end_module_called ) {
        std::stringstream msg;
        msg << "module '" << name() << "'";
        SC_REPORT_WARNING( SC_ID_END_MODULE_NOT_CALLED_, msg.str().c_str() );
        if( error_ ) {
            SC_REPORT_WARNING( SC_ID_HIER_NAME_INCORRECT_, 0 );
        }
        error_ = true;
    }
    hierarchy_scope scope(this);
    end_of_elaboration();
}